

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::createPlainSocket(QSslSocketPrivate *this,OpenMode openMode)

{
  QObject *pQVar1;
  QTcpSocket *pQVar2;
  undefined4 in_ESI;
  QSslSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslSocket *q;
  undefined8 in_stack_fffffffffffffeb8;
  QObject *name;
  QAbstractSocket *in_stack_fffffffffffffec0;
  QRingBufferRef *this_00;
  QObject *parent;
  QTcpSocket *this_01;
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [32];
  undefined1 local_20 [16];
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  pQVar1 = (QObject *)q_func(in_RDI);
  local_10 = local_c;
  QIODevice::setOpenMode((QFlags_conflict *)pQVar1);
  QAbstractSocket::setSocketState
            (in_stack_fffffffffffffec0,(SocketState)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  QAbstractSocket::setSocketError
            (in_stack_fffffffffffffec0,(SocketError)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  QAbstractSocket::setLocalPort
            (in_stack_fffffffffffffec0,(quint16)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
  this_00 = (QRingBufferRef *)(local_20 + 8);
  name = pQVar1;
  QHostAddress::QHostAddress((QHostAddress *)this_00);
  QAbstractSocket::setLocalAddress((QAbstractSocket *)this_00,(QHostAddress *)name);
  QHostAddress::~QHostAddress((QHostAddress *)0x3a102c);
  QAbstractSocket::setPeerPort((QAbstractSocket *)this_00,(quint16)((ulong)name >> 0x30));
  this_01 = (QTcpSocket *)local_20;
  parent = pQVar1;
  QHostAddress::QHostAddress((QHostAddress *)this_00);
  QAbstractSocket::setPeerAddress((QAbstractSocket *)this_00,(QHostAddress *)name);
  QHostAddress::~QHostAddress((QHostAddress *)0x3a1078);
  QString::QString((QString *)0x3a1097);
  QAbstractSocket::setPeerName((QAbstractSocket *)this_00,(QString *)name);
  QString::~QString((QString *)0x3a10b0);
  pQVar2 = (QTcpSocket *)operator_new(0x10);
  QTcpSocket::QTcpSocket(this_01,parent);
  in_RDI->plainSocket = pQVar2;
  QObject::connect(local_40,(char *)in_RDI->plainSocket,(QObject *)"2connected()",(char *)pQVar1,
                   0x3ed1c3);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)in_RDI->plainSocket,(QObject *)"2hostFound()",(char *)pQVar1,
                   0x3ed1e4);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)in_RDI->plainSocket,(QObject *)"2disconnected()",(char *)pQVar1,
                   0x3ed1f8);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect(local_58,(char *)in_RDI->plainSocket,
                   (QObject *)"2stateChanged(QAbstractSocket::SocketState)",(char *)pQVar1,0x3ed20f)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)in_RDI->plainSocket,
                   (QObject *)"2errorOccurred(QAbstractSocket::SocketError)",(char *)pQVar1,0x3ed242
                  );
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,(char *)in_RDI->plainSocket,(QObject *)"2readyRead()",(char *)pQVar1,
                   0x3ed26e);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,(char *)in_RDI->plainSocket,(QObject *)"2channelReadyRead(int)",
                   (char *)pQVar1,0x3ed299);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,(char *)in_RDI->plainSocket,(QObject *)"2bytesWritten(qint64)",
                   (char *)pQVar1,0x3ed2b7);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,(char *)in_RDI->plainSocket,
                   (QObject *)"2channelBytesWritten(int,qint64)",(char *)pQVar1,0x3ed2f5);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,(char *)in_RDI->plainSocket,(QObject *)"2readChannelFinished()",
                   (char *)pQVar1,0x3ed31d);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,(char *)in_RDI->plainSocket,
                   (QObject *)"2proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)",
                   (char *)pQVar1,0x3d689d);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QIODevicePrivate::QRingBufferRef::clear(this_00);
  QIODevicePrivate::QRingBufferRef::clear(this_00);
  in_RDI->connectionEncrypted = false;
  QSslCertificate::clear((QSslCertificate *)this_00);
  QList<QSslCertificate>::clear((QList<QSslCertificate> *)this_00);
  in_RDI->mode = UnencryptedMode;
  (**(code **)(*(long *)pQVar1 + 0x108))
            (pQVar1,(in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.readBufferMaxSize
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::createPlainSocket(QIODevice::OpenMode openMode)
{
    Q_Q(QSslSocket);
    q->setOpenMode(openMode); // <- from QIODevice
    q->setSocketState(QAbstractSocket::UnconnectedState);
    q->setSocketError(QAbstractSocket::UnknownSocketError);
    q->setLocalPort(0);
    q->setLocalAddress(QHostAddress());
    q->setPeerPort(0);
    q->setPeerAddress(QHostAddress());
    q->setPeerName(QString());

    plainSocket = new QTcpSocket(q);
    q->connect(plainSocket, SIGNAL(connected()),
               q, SLOT(_q_connectedSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(hostFound()),
               q, SLOT(_q_hostFoundSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(disconnected()),
               q, SLOT(_q_disconnectedSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
               q, SLOT(_q_stateChangedSlot(QAbstractSocket::SocketState)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)),
               q, SLOT(_q_errorSlot(QAbstractSocket::SocketError)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(readyRead()),
               q, SLOT(_q_readyReadSlot()),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(channelReadyRead(int)),
               q, SLOT(_q_channelReadyReadSlot(int)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(bytesWritten(qint64)),
               q, SLOT(_q_bytesWrittenSlot(qint64)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(channelBytesWritten(int,qint64)),
               q, SLOT(_q_channelBytesWrittenSlot(int,qint64)),
               Qt::DirectConnection);
    q->connect(plainSocket, SIGNAL(readChannelFinished()),
               q, SLOT(_q_readChannelFinishedSlot()),
               Qt::DirectConnection);
#ifndef QT_NO_NETWORKPROXY
    q->connect(plainSocket, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)),
               q, SIGNAL(proxyAuthenticationRequired(QNetworkProxy,QAuthenticator*)));
#endif

    buffer.clear();
    writeBuffer.clear();
    connectionEncrypted = false;
    configuration.peerCertificate.clear();
    configuration.peerCertificateChain.clear();
    mode = QSslSocket::UnencryptedMode;
    q->setReadBufferSize(readBufferMaxSize);
}